

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_test_helper.cpp
# Opt level: O0

bool duckdb::ArrowTestHelper::CompareResults
               (Connection *con,
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
               *arrow,unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                      *duck,string *query)

{
  pointer args_2;
  pointer args_3;
  long lVar1;
  undefined8 uVar2;
  MaterializedRelation *pMVar3;
  shared_ptr<duckdb::ClientContext,_true> *in_RDX;
  QueryResult *in_RSI;
  MaterializedQueryResult *except_result;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> except_result_p;
  shared_ptr<duckdb::SetOpRelation,_true> except_rel;
  shared_ptr<duckdb::MaterializedRelation,_true> duck_rel;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  duck_collection;
  shared_ptr<duckdb::MaterializedRelation,_true> arrow_rel;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  arrow_collection;
  string error;
  MaterializedQueryResult *materialized_arrow;
  shared_ptr<duckdb::MaterializedRelation,_true> *in_stack_fffffffffffffeb0;
  char (*in_stack_fffffffffffffee0) [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffee8;
  string local_f8 [32];
  string local_d8 [32];
  MaterializedQueryResult *local_b8;
  undefined1 local_a2;
  undefined1 local_a1;
  string local_50 [32];
  type local_30;
  byte local_1;
  
  local_30 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)in_stack_fffffffffffffeb0);
  std::__cxx11::string::string(local_50);
  duckdb::MaterializedQueryResult::TakeCollection();
  make_shared_ptr<duckdb::MaterializedRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[6]>
            (in_RDX,(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     *)in_RSI,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  args_2 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)in_stack_fffffffffffffeb0);
  duckdb::MaterializedQueryResult::TakeCollection();
  args_3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)in_stack_fffffffffffffeb0);
  make_shared_ptr<duckdb::MaterializedRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[5]>
            (in_RDX,(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     *)in_RSI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)args_2,(char (*) [5])args_3);
  local_a1 = 2;
  local_a2 = 1;
  make_shared_ptr<duckdb::SetOpRelation,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::SetOperationType,bool>
            ((shared_ptr<duckdb::MaterializedRelation,_true> *)in_RDX,
             (shared_ptr<duckdb::MaterializedRelation,_true> *)in_RSI,(SetOperationType *)args_2,
             (bool *)args_3);
  shared_ptr<duckdb::SetOpRelation,_true>::operator->
            ((shared_ptr<duckdb::SetOpRelation,_true> *)in_stack_fffffffffffffeb0);
  duckdb::Relation::Execute();
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator->
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffffeb0);
  local_b8 = QueryResult::Cast<duckdb::MaterializedQueryResult>(in_RSI);
  lVar1 = duckdb::MaterializedQueryResult::RowCount();
  local_1 = lVar1 == 0;
  if (!(bool)local_1) {
    printf("-------------------------------------\n");
    uVar2 = std::__cxx11::string::c_str();
    printf("Arrow round-trip failed: %s\n",uVar2);
    printf("-------------------------------------\n");
    uVar2 = std::__cxx11::string::c_str();
    printf("Query: %s\n",uVar2);
    printf("-----------------DuckDB-------------------\n");
    pMVar3 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->(in_stack_fffffffffffffeb0);
    (**(code **)(*(long *)pMVar3 + 0x30))(local_d8,pMVar3,0);
    duckdb::Printer::Print(local_d8);
    std::__cxx11::string::~string(local_d8);
    printf("-----------------Arrow--------------------\n");
    pMVar3 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->
                       ((shared_ptr<duckdb::MaterializedRelation,_true> *)pMVar3);
    (**(code **)(*(long *)pMVar3 + 0x30))(local_f8,pMVar3,0);
    duckdb::Printer::Print(local_f8);
    std::__cxx11::string::~string(local_f8);
    printf("-------------------------------------\n");
  }
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::~unique_ptr
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             0x68ce21);
  shared_ptr<duckdb::SetOpRelation,_true>::~shared_ptr
            ((shared_ptr<duckdb::SetOpRelation,_true> *)0x68ce2e);
  shared_ptr<duckdb::MaterializedRelation,_true>::~shared_ptr
            ((shared_ptr<duckdb::MaterializedRelation,_true> *)0x68ce3b);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 *)0x68ce48);
  shared_ptr<duckdb::MaterializedRelation,_true>::~shared_ptr
            ((shared_ptr<duckdb::MaterializedRelation,_true> *)0x68ce55);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 *)0x68ce62);
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool ArrowTestHelper::CompareResults(Connection &con, unique_ptr<QueryResult> arrow,
                                     unique_ptr<MaterializedQueryResult> duck, const string &query) {
	auto &materialized_arrow = (MaterializedQueryResult &)*arrow;
	// compare the results
	string error;

	auto arrow_collection = materialized_arrow.TakeCollection();
	auto arrow_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(arrow_collection),
	                                                       materialized_arrow.names, "arrow");

	auto duck_collection = duck->TakeCollection();
	auto duck_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(duck_collection), duck->names, "duck");

	// We perform a SELECT * FROM "duck_rel" EXCEPT ALL SELECT * FROM "arrow_rel"
	// this will tell us if there are tuples missing from 'arrow_rel' that are present in 'duck_rel'
	auto except_rel = make_shared_ptr<SetOpRelation>(duck_rel, arrow_rel, SetOperationType::EXCEPT, /*setop_all=*/true);
	auto except_result_p = except_rel->Execute();
	auto &except_result = except_result_p->Cast<MaterializedQueryResult>();
	if (except_result.RowCount() != 0) {
		printf("-------------------------------------\n");
		printf("Arrow round-trip failed: %s\n", error.c_str());
		printf("-------------------------------------\n");
		printf("Query: %s\n", query.c_str());
		printf("-----------------DuckDB-------------------\n");
		Printer::Print(duck_rel->ToString(0));
		printf("-----------------Arrow--------------------\n");
		Printer::Print(arrow_rel->ToString(0));
		printf("-------------------------------------\n");
		return false;
	}
	return true;
}